

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

void __thiscall
despot::BaseRockSample::PrintBelief(BaseRockSample *this,Belief *belief,ostream *out)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  long *plVar6;
  ostream *poVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> pos_probs;
  vector<double,_std::allocator<double>_> rock_probs;
  vector<double,_std::allocator<double>_> local_70;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> local_50;
  undefined8 local_38;
  
  plVar6 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,(long)this->num_rocks_,(allocator_type *)&local_70);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_70,(ulong)(uint)(this->size_ * this->size_),(allocator_type *)&local_58);
  lVar14 = *plVar6;
  lVar10 = plVar6[1] - lVar14;
  if (lVar10 != 0) {
    lVar10 = lVar10 >> 3;
    uVar1 = this->num_rocks_;
    lVar11 = 0;
    do {
      lVar3 = *(long *)(lVar14 + lVar11 * 8);
      uVar2 = *(uint *)(lVar3 + 0xc);
      if (0 < (int)uVar1) {
        uVar13 = 0;
        do {
          dVar15 = 1.0;
          if ((uVar2 >> ((uint)uVar13 & 0x1f) & 1) == 0) {
            dVar15 = 0.0;
          }
          local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] =
               dVar15 * *(double *)(lVar3 + 0x18) +
               local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
      iVar12 = (int)uVar2 >> ((byte)uVar1 & 0x1f);
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12] =
           *(double *)(lVar3 + 0x18) +
           local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar12];
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar10 + (ulong)(lVar10 == 0));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Rock belief:",0xc);
  if (0 < this->num_rocks_) {
    lVar14 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      std::ostream::_M_insert<double>
                (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->num_rocks_);
  }
  cVar5 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Position belief:",0x10);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar13 = 0;
    pdVar8 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (0.0 < pdVar8[uVar13]) {
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
        lVar14 = (long)(this->grid_).xsize_;
        uVar4 = (ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff;
        despot::Coord::Coord
                  ((Coord *)&local_58,(int)((long)uVar4 % lVar14),(int)((long)uVar4 / lVar14));
        local_38 = local_58;
        poVar7 = (ostream *)despot::operator<<(out,(Coord *)&local_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        std::ostream::_M_insert<double>
                  (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar13]);
        pdVar8 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)pdVar9 - (long)pdVar8 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BaseRockSample::PrintBelief(const Belief& belief, ostream& out) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief&>(belief).particles();

	vector<double> rock_probs(num_rocks_);
	vector<double> pos_probs(size_ * size_);
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		for (int rock = 0; rock < num_rocks_; rock++)
			rock_probs[rock] += CheckFlag(particle->state_id, rock)
				* particle->weight;
		pos_probs[particle->state_id >> num_rocks_] += particle->weight;
	}

	out << "Rock belief:";
	for (int rock = 0; rock < num_rocks_; rock++)
		out << " " << rock_probs[rock];
	out << endl;

	out << "Position belief:";
	for (int i = 0; i < pos_probs.size(); i++) {
		if (pos_probs[i] > 0)
			out << " " << IndexToCoord(i) << ":" << pos_probs[i];
	}
	out << endl;
}